

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYs<unsigned_short>,_ImPlot::TransformerLinLin>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYs<unsigned_short>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  int iVar3;
  GetterXsYs<unsigned_short> *pGVar4;
  GetterXsYs<unsigned_short> *pGVar5;
  ImDrawVert *pIVar6;
  ImDrawIdx *pIVar7;
  float fVar8;
  undefined1 auVar9 [12];
  int iVar10;
  long lVar11;
  ImDrawIdx IVar12;
  ushort uVar13;
  ImPlotContext *gp;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ImVec2 IVar20;
  double dVar21;
  ImVec2 IVar22;
  double dVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  undefined1 auVar35 [16];
  
  pGVar4 = this->Getter1;
  pGVar5 = this->Getter2;
  iVar10 = pGVar4->Count;
  lVar14 = (long)(((pGVar4->Offset + prim + 1) % iVar10 + iVar10) % iVar10) * (long)pGVar4->Stride;
  iVar10 = this->Transformer->YAxis;
  iVar3 = pGVar5->Count;
  IVar20 = GImPlot->PixelRange[iVar10].Min;
  dVar21 = (double)IVar20.x;
  dVar23 = (double)IVar20.y;
  dVar1 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  dVar2 = GImPlot->CurrentPlot->YAxis[iVar10].Range.Min;
  lVar11 = (long)(((prim + 1 + pGVar5->Offset) % iVar3 + iVar3) % iVar3) * (long)pGVar5->Stride;
  IVar20.x = (float)(((double)*(ushort *)((long)pGVar4->Xs + lVar14) - dVar1) * GImPlot->Mx + dVar21
                    );
  IVar20.y = (float)(((double)*(ushort *)((long)pGVar4->Ys + lVar14) - dVar2) * GImPlot->My[iVar10]
                    + dVar23);
  IVar22.x = (float)(((double)*(ushort *)((long)pGVar5->Xs + lVar11) - dVar1) * GImPlot->Mx + dVar21
                    );
  IVar22.y = (float)(((double)*(ushort *)((long)pGVar5->Ys + lVar11) - dVar2) * GImPlot->My[iVar10]
                    + dVar23);
  fVar8 = (this->P12).x;
  fVar24 = (this->P12).y;
  fVar26 = (this->P11).x;
  fVar27 = (this->P11).y;
  uVar18 = -(uint)(fVar27 < fVar24);
  fVar25 = (float)(~-(uint)(fVar8 <= fVar26) & (uint)fVar8 | (uint)fVar26 & -(uint)(fVar8 <= fVar26)
                  );
  fVar28 = (float)(~-(uint)(fVar24 <= fVar27) & (uint)fVar24 |
                  (uint)fVar27 & -(uint)(fVar24 <= fVar27));
  fVar31 = (float)(~-(uint)(fVar26 < fVar8) & (uint)fVar8 | (uint)fVar26 & -(uint)(fVar26 < fVar8));
  fVar39 = (float)(~uVar18 & (uint)fVar24 | (uint)fVar27 & uVar18);
  uVar15 = -(uint)(IVar20.x <= fVar25);
  uVar16 = -(uint)(IVar20.y <= fVar28);
  uVar17 = -(uint)(fVar31 < IVar20.x);
  uVar19 = -(uint)(fVar39 < IVar20.y);
  fVar25 = (float)(~uVar15 & (uint)IVar20.x | (uint)fVar25 & uVar15);
  fVar28 = (float)(~uVar16 & (uint)IVar20.y | (uint)fVar28 & uVar16);
  fVar31 = (float)(~uVar17 & (uint)IVar20.x | (uint)fVar31 & uVar17);
  fVar39 = (float)(~uVar19 & (uint)IVar20.y | (uint)fVar39 & uVar19);
  uVar15 = -(uint)(IVar22.x <= fVar25);
  uVar16 = -(uint)(IVar22.y <= fVar28);
  uVar17 = -(uint)(fVar31 < IVar22.x);
  uVar19 = -(uint)(fVar39 < IVar22.y);
  auVar30._0_4_ = (uint)fVar25 & uVar15;
  auVar30._4_4_ = (uint)fVar28 & uVar16;
  auVar30._8_4_ = (uint)fVar31 & uVar17;
  auVar30._12_4_ = (uint)fVar39 & uVar19;
  auVar36._0_4_ = ~uVar15 & (uint)IVar22.x;
  auVar36._4_4_ = ~uVar16 & (uint)IVar22.y;
  auVar36._8_4_ = ~uVar17 & (uint)IVar22.x;
  auVar36._12_4_ = ~uVar19 & (uint)IVar22.y;
  auVar36 = auVar36 | auVar30;
  fVar25 = (cull_rect->Min).y;
  auVar38._4_4_ = -(uint)(fVar25 < auVar36._4_4_);
  auVar38._0_4_ = -(uint)((cull_rect->Min).x < auVar36._0_4_);
  auVar9._4_8_ = auVar36._8_8_;
  auVar9._0_4_ = -(uint)(auVar36._4_4_ < fVar25);
  auVar37._0_8_ = auVar9._0_8_ << 0x20;
  auVar37._8_4_ = -(uint)(auVar36._8_4_ < (cull_rect->Max).x);
  auVar37._12_4_ = -(uint)(auVar36._12_4_ < (cull_rect->Max).y);
  auVar38._8_8_ = auVar37._8_8_;
  iVar10 = movmskps((int)lVar11,auVar38);
  if (iVar10 == 0xf) {
    fVar28 = IVar20.y * fVar26 - fVar27 * IVar20.x;
    fVar31 = IVar22.y * fVar8 - fVar24 * IVar22.x;
    fVar25 = fVar24 - IVar22.y;
    auVar32._4_4_ = fVar25;
    auVar32._0_4_ = fVar25;
    auVar32._8_4_ = fVar25;
    auVar32._12_4_ = fVar25;
    auVar33._4_12_ = auVar32._4_12_;
    auVar33._0_4_ = fVar25 * (fVar26 - IVar20.x) - (fVar27 - IVar20.y) * (fVar8 - IVar22.x);
    auVar29._0_4_ = fVar28 * (fVar8 - IVar22.x) - fVar31 * (fVar26 - IVar20.x);
    auVar29._4_4_ = fVar28 * fVar25 - fVar31 * (fVar27 - IVar20.y);
    auVar29._8_4_ = IVar20.y * 0.0 - IVar22.y * 0.0;
    auVar29._12_4_ = IVar20.y * 0.0 - IVar22.y * 0.0;
    auVar35._0_8_ = auVar33._0_8_;
    auVar35._8_4_ = fVar25;
    auVar35._12_4_ = fVar25;
    auVar34._8_8_ = auVar35._8_8_;
    auVar34._4_4_ = auVar33._0_4_;
    auVar34._0_4_ = auVar33._0_4_;
    auVar30 = divps(auVar29,auVar34);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6->col = this->Col;
    pIVar6[1].pos = IVar20;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[1].col = this->Col;
    pIVar6[2].pos = auVar30._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[2].col = this->Col;
    pIVar6[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[3].col = this->Col;
    pIVar6[4].pos = IVar22;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar6 + 5;
    uVar15 = DrawList->_VtxCurrentIdx;
    pIVar7 = DrawList->_IdxWritePtr;
    IVar12 = (ImDrawIdx)uVar15;
    *pIVar7 = IVar12;
    uVar13 = (byte)((byte)uVar18 & IVar22.y < IVar20.y | -(fVar24 < fVar27) & -(IVar20.y < IVar22.y)
                   ) & 1;
    pIVar7[1] = IVar12 + uVar13 + 1;
    pIVar7[2] = IVar12 + 3;
    pIVar7[3] = IVar12 + 1;
    pIVar7[4] = (uVar13 ^ 3) + IVar12;
    pIVar7[5] = IVar12 + 4;
    DrawList->_IdxWritePtr = pIVar7 + 6;
    DrawList->_VtxCurrentIdx = uVar15 + 5;
  }
  this->P11 = IVar20;
  this->P12 = IVar22;
  return (char)iVar10 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }